

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbsExpression.cpp
# Opt level: O3

BaseExpressionPtr __thiscall
Kandinsky::AbsExpression::derivative(AbsExpression *this,VariableExpressionPtr *variable)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  shared_ptr<Kandinsky::BaseExpression> sVar2;
  BaseExpressionPtr BVar3;
  shared_ptr<Kandinsky::BaseExpression> sStack_58;
  SignExpression local_48;
  Expression local_30;
  
  sign<std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_48,
             (shared_ptr<Kandinsky::BaseExpression> *)
             &(variable->
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  (*((variable->super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>).
     _M_refcount._M_pi)->_vptr__Sp_counted_base[1])(&sStack_58);
  operator*<Kandinsky::SignExpression,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_30,&local_48,&sStack_58);
  sVar2 = BaseExpression::makePtr<Kandinsky::Expression>(&local_30);
  _Var1 = sVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  local_30._vptr_Expression = (_func_int **)&PTR_variables_0010f970;
  if (local_30.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.m_baseExpressionPtr.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX;
  }
  if (sStack_58.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_58.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  local_48.super_UnaryExpression.super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR___cxa_pure_virtual_0010f780;
  if (local_48.super_UnaryExpression.m_arg.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super_UnaryExpression.m_arg.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  BVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var1._M_pi;
  BVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (BaseExpressionPtr)
         BVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr AbsExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return BaseExpression::makePtr(sign(m_arg) * m_arg->derivative(variable));
    }